

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

string * phosg::escape_controls(string *__return_storage_ptr__,string *s,bool escape_non_ascii)

{
  ulong uVar1;
  size_type sVar2;
  byte *pbVar3;
  string local_60;
  byte local_29;
  ulong uStack_28;
  char ch;
  size_t x;
  string *psStack_18;
  bool escape_non_ascii_local;
  string *s_local;
  string *ret;
  
  x._6_1_ = 0;
  x._7_1_ = escape_non_ascii;
  psStack_18 = s;
  s_local = __return_storage_ptr__;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  uStack_28 = 0;
  do {
    uVar1 = uStack_28;
    sVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (psStack_18);
    if (sVar2 <= uVar1) {
      return __return_storage_ptr__;
    }
    pbVar3 = (byte *)::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                               (psStack_18,uStack_28);
    local_29 = *pbVar3;
    if (local_29 == 0x22) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,"\\\"");
    }
    else if (local_29 == 0x27) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,"\\\'");
    }
    else if (local_29 == 0x5c) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,"\\\\");
    }
    else if (local_29 == 9) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,"\\t");
    }
    else if (local_29 == 0xd) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,"\\r");
    }
    else if (local_29 == 10) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,"\\n");
    }
    else if (local_29 == 0xc) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,"\\f");
    }
    else if (local_29 == 8) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,"\\b");
    }
    else if (local_29 == 7) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,"\\a");
    }
    else if (local_29 == 0xb) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,"\\v");
    }
    else {
      if ((x._7_1_ & 1) == 0) {
        if ((((int)(char)local_29 & 0x80U) == 0) && (((char)local_29 < ' ' || (local_29 == 0x7f))))
        goto LAB_00118a11;
      }
      else if (((char)local_29 < ' ') || ('~' < (char)local_29)) {
LAB_00118a11:
        string_printf_abi_cxx11_(&local_60,"\\x%02X",(ulong)local_29);
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=(__return_storage_ptr__,&local_60);
        ::std::__cxx11::string::~string((string *)&local_60);
        goto LAB_00118a7f;
      }
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,local_29);
    }
LAB_00118a7f:
    uStack_28 = uStack_28 + 1;
  } while( true );
}

Assistant:

string escape_controls(const string& s, bool escape_non_ascii) {
  string ret;
  for (size_t x = 0; x < s.size(); x++) {
    char ch = s[x];
    if (ch == '\"') {
      ret += "\\\"";
    } else if (ch == '\'') {
      ret += "\\\'";
    } else if (ch == '\\') {
      ret += "\\\\";
    } else if (ch == '\t') {
      ret += "\\t";
    } else if (ch == '\r') {
      ret += "\\r";
    } else if (ch == '\n') {
      ret += "\\n";
    } else if (ch == '\f') {
      ret += "\\f";
    } else if (ch == '\b') {
      ret += "\\b";
    } else if (ch == '\a') {
      ret += "\\a";
    } else if (ch == '\v') {
      ret += "\\v";
    } else if (escape_non_ascii ? (ch < 0x20 || ch > 0x7E) : (!(ch & 0x80) && ((ch < 0x20) || ch == 0x7F))) {
      ret += string_printf("\\x%02X", static_cast<uint8_t>(ch));
    } else {
      ret += ch;
    }
  }
  return ret;
}